

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O2

void gray_rgb565D_convert
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
               JSAMPARRAY output_buf,int num_rows)

{
  byte bVar1;
  byte bVar2;
  JSAMPLE *pJVar3;
  ushort *puVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  byte *pbVar8;
  long lVar9;
  
  pJVar3 = cinfo->sample_range_limit;
  uVar5 = cinfo->output_width;
  uVar7 = dither_matrix[cinfo->output_scanline & 3];
  while (0 < num_rows) {
    pbVar8 = (*input_buf)[input_row];
    puVar4 = (ushort *)*output_buf;
    if (((ulong)puVar4 & 3) != 0) {
      bVar1 = *pbVar8;
      pbVar8 = pbVar8 + 1;
      bVar1 = pJVar3[(ulong)bVar1 + (uVar7 & 0xff)];
      *puVar4 = (ushort)(bVar1 >> 3) + (bVar1 & 0xfffc) * 8 | (bVar1 & 0xf8) << 8;
      puVar4 = puVar4 + 1;
      uVar5 = uVar5 - 1;
    }
    num_rows = num_rows + -1;
    input_row = input_row + 1;
    output_buf = output_buf + 1;
    for (lVar9 = 0; uVar5 >> 1 != (uint)lVar9; lVar9 = lVar9 + 1) {
      bVar1 = pJVar3[(ulong)pbVar8[lVar9 * 2] + (uVar7 & 0xff)];
      uVar6 = (uint)(uVar7 >> 8);
      bVar2 = pJVar3[(ulong)pbVar8[lVar9 * 2 + 1] + (uVar7 >> 8 & 0xff)];
      uVar7 = (ulong)(uVar6 << 0x18 | (uVar6 & 0xffff00 | (int)uVar7 << 0x18) >> 8);
      *(uint *)(puVar4 + lVar9 * 2) =
           (uint)(bVar1 >> 3) + (bVar1 & 0xfffffffc) * 8 | (bVar1 & 0xf8) << 8 |
           ((uint)(bVar2 >> 3) | (bVar2 & 0xf8) * 0x100 + (bVar2 & 0xfffffffc) * 8) << 0x10;
    }
    if ((uVar5 & 1) != 0) {
      bVar1 = pJVar3[(ulong)pbVar8[lVar9 * 2] + (uVar7 & 0xff)];
      puVar4[lVar9 * 2] = (ushort)(bVar1 >> 3) + (bVar1 & 0xfffc) * 8 | (bVar1 & 0xf8) << 8;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
gray_rgb565D_convert(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                     JDIMENSION input_row, JSAMPARRAY output_buf, int num_rows)
{
  if (is_big_endian())
    gray_rgb565D_convert_be(cinfo, input_buf, input_row, output_buf, num_rows);
  else
    gray_rgb565D_convert_le(cinfo, input_buf, input_row, output_buf, num_rows);
}